

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprNode *pFVar1;
  Fts5ExprNode *pChild;
  int local_20;
  int nEof;
  int i;
  int rc;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  nEof = 0;
  pNode->bEof = 0;
  pNode->bNomatch = 0;
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    nEof = fts5ExprNearInitAll(pExpr,pNode);
  }
  else if (pNode->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
    pNode->bEof = 1;
  }
  else {
    pChild._4_4_ = 0;
    for (local_20 = 0; local_20 < pNode->nChild && nEof == 0; local_20 = local_20 + 1) {
      pFVar1 = pNode->apChild[local_20];
      nEof = fts5ExprNodeFirst(pExpr,pNode->apChild[local_20]);
      pChild._4_4_ = pFVar1->bEof + pChild._4_4_;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;
    if (pNode->eType == 1) {
      if (pNode->nChild == pChild._4_4_) {
        fts5ExprSetEof(pNode);
      }
    }
    else if (pNode->eType == 2) {
      if (0 < pChild._4_4_) {
        fts5ExprSetEof(pNode);
      }
    }
    else {
      pNode->bEof = pNode->apChild[0]->bEof;
    }
  }
  if (nEof == 0) {
    nEof = fts5ExprNodeTest(pExpr,pNode);
  }
  return nEof;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}